

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void thread_main(void *arg)

{
  ssize_t sVar1;
  int iVar2;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  char buf [4096];
  undefined1 local_1200 [8];
  uv_buf_t local_11f8;
  uv_fs_t local_11e8;
  char local_1028 [4096];
  
  local_11f8 = uv_buf_init(local_1028,0x1000);
  uv_barrier_wait((uv_barrier_t *)arg);
  uv_sleep(100);
  do {
    do {
      iVar2 = uv_fs_read((uv_loop_t *)0x0,&local_11e8,*(uv_os_fd_t *)((long)arg + 0x20),&local_11f8,
                         1,-1,(uv_fs_cb)0x0);
      sVar1 = local_11e8.result;
      uv_fs_req_cleanup(&local_11e8);
    } while (0 < sVar1);
  } while (((void *)sVar1 == (void *)0xffffffffffffffff) && (iVar2 == -4));
  local_1200 = (undefined1  [8])sVar1;
  if ((void *)sVar1 == (void *)0x0) {
    return;
  }
  handle = (uv_handle_t *)local_1200;
  thread_main_cold_1();
  iVar2 = uv_is_closing(handle);
  if (iVar2 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void thread_main(void* arg) {
  const struct thread_ctx* ctx;
  int size;
  char* data;

  ctx = (struct thread_ctx*)arg;
  size = ctx->size;
  data = ctx->data;

  while (size > 0) {
    ssize_t result;
    int nbytes;
    nbytes = size < ctx->interval ? size : ctx->interval;
    if (ctx->doread) {
      result = write(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors) */
      ASSERT_EQ(result, nbytes);
    } else {
      result = read(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors),
       * but might get a partial read if we are faster than the writer
       */
      ASSERT(result > 0 && result <= nbytes);
    }

    pthread_kill(ctx->pid, SIGUSR1);
    size -= result;
    data += result;
  }
}